

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>::Construct
                   (DB *db,LIST *params)

{
  IfcStyledItem *in;
  
  in = (IfcStyledItem *)operator_new(0x88);
  *(undefined8 *)&in->field_0x78 = 0;
  *(char **)&in->field_0x80 = "IfcStyledItem";
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).field_0x10 =
       0;
  *(undefined ***)in = &PTR__IfcStyledItem_00865050;
  *(undefined ***)&in->field_0x70 = &PTR__IfcStyledItem_008650a0;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcStyledItem_00865078;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).field_0x18 = 0;
  *(undefined8 *)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).field_0x20 =
       0;
  *(undefined8 *)&in->field_0x38 = 0;
  *(undefined8 *)&in->field_0x40 = 0;
  (in->Name).ptr._M_dataplus._M_p = (pointer)&(in->Name).ptr.field_2;
  (in->Name).ptr._M_string_length = 0;
  (in->Name).ptr.field_2._M_local_buf[0] = '\0';
  (in->Name).have = false;
  GenericFill<Assimp::IFC::Schema_2x3::IfcStyledItem>(db,params,in);
  return (Object *)(&in->field_0x0 + *(long *)(*(long *)in + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }